

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    uVar2 = *(ulong *)left->data;
    uVar3 = *(ulong *)((long)left->data + 8);
    uVar4 = *(ulong *)right->data;
    uVar5 = *(ulong *)((long)right->data + 8);
    iVar7 = (int)(uVar4 >> 0x20);
    if ((uVar2 >> 0x20 != uVar4 >> 0x20 || (int)uVar2 != (int)uVar4) ||
       (bVar9 = true, iVar7 = (int)(uVar2 >> 0x20), uVar3 != uVar5)) {
      lVar6 = ((long)uVar2 >> 0x20) + (long)uVar3 / 86400000000;
      lVar8 = (long)iVar7 + (long)uVar5 / 86400000000;
      bVar9 = false;
      if (((long)(int)uVar2 + lVar6 / 0x1e == (long)(int)uVar4 + lVar8 / 0x1e) &&
         (bVar9 = false, lVar6 % 0x1e == lVar8 % 0x1e)) {
        bVar9 = (long)uVar3 % 86400000000 == (long)uVar5 % 86400000000;
      }
    }
    *result->data = bVar9;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}